

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall TxConfirmStats::ClearCurrent(TxConfirmStats *this,uint nBlockHeight)

{
  int *piVar1;
  long lVar2;
  pointer pvVar3;
  long lVar4;
  pointer piVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (long)(this->buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    pvVar3 = (this->unconfTxs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    lVar4 = *(long *)&pvVar3[(ulong)nBlockHeight %
                             (ulong)(((long)(this->unconfTxs).
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pvVar3 >> 3) * -0x5555555555555555)].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
    piVar5 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar1 = piVar5 + uVar7;
      *piVar1 = *piVar1 + *(int *)(lVar4 + uVar7 * 4);
      *(undefined4 *)(lVar4 + uVar7 * 4) = 0;
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < (ulong)(lVar6 >> 3));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::ClearCurrent(unsigned int nBlockHeight)
{
    for (unsigned int j = 0; j < buckets.size(); j++) {
        oldUnconfTxs[j] += unconfTxs[nBlockHeight % unconfTxs.size()][j];
        unconfTxs[nBlockHeight%unconfTxs.size()][j] = 0;
    }
}